

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O2

bool __thiscall BuildLog::Recompact(BuildLog *this,string *path,BuildLogUser *user,string *err)

{
  Metrics *this_00;
  char cVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  int *piVar4;
  Metric *pMVar5;
  __node_base *p_Var6;
  long lVar7;
  BuildLog *this_01;
  size_t i;
  ulong uVar8;
  string temp_path;
  vector<StringPiece,_std::allocator<StringPiece>_> dead_outputs;
  ScopedMetric metrics_h_scoped;
  
  if (Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)::
      metrics_h_metric == '\0') {
    iVar3 = __cxa_guard_acquire(&Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)
                                 ::metrics_h_metric);
    this_00 = g_metrics;
    if (iVar3 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar5 = (Metric *)0x0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&temp_path,".ninja_log recompact",(allocator<char> *)&dead_outputs);
        pMVar5 = Metrics::NewMetric(this_00,&temp_path);
        std::__cxx11::string::~string((string *)&temp_path);
      }
      Recompact::metrics_h_metric = pMVar5;
      __cxa_guard_release(&Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)
                           ::metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&metrics_h_scoped,Recompact::metrics_h_metric);
  Close(this);
  std::operator+(&temp_path,path,".recompact");
  __stream = fopen(temp_path._M_dataplus._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    piVar4 = __errno_location();
    strerror(*piVar4);
    std::__cxx11::string::assign((char *)err);
  }
  else {
    iVar3 = fprintf(__stream,"# ninja log v%d\n",5);
    if (-1 < iVar3) {
      dead_outputs.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      dead_outputs.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      dead_outputs.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var6 = &(this->entries_)._M_h._M_before_begin;
LAB_001060c7:
      while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
        this_01 = (BuildLog *)user;
        cVar1 = (*(code *)**(undefined8 **)user)
                          (user,p_Var6[1]._M_nxt,
                           *(_Hash_node_base **)
                            &((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor);
        if (cVar1 == '\0') goto LAB_001060f2;
        std::vector<StringPiece,_std::allocator<StringPiece>_>::push_back
                  (&dead_outputs,(value_type *)(p_Var6 + 1));
      }
      lVar7 = 0;
      for (uVar8 = 0;
          uVar8 < (ulong)((long)dead_outputs.
                                super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)dead_outputs.
                                super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 4); uVar8 = uVar8 + 1) {
        std::
        _Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_erase((_Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,(long)&(dead_outputs.
                                   super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->str_ + lVar7);
        lVar7 = lVar7 + 0x10;
      }
      fclose(__stream);
      iVar3 = unlink((path->_M_dataplus)._M_p);
      if (iVar3 < 0) {
LAB_0010619d:
        piVar4 = __errno_location();
        strerror(*piVar4);
        std::__cxx11::string::assign((char *)err);
        goto LAB_001061b6;
      }
      iVar3 = rename(temp_path._M_dataplus._M_p,(path->_M_dataplus)._M_p);
      bVar2 = true;
      if (iVar3 < 0) goto LAB_0010619d;
      goto LAB_001061b8;
    }
    piVar4 = __errno_location();
    strerror(*piVar4);
    std::__cxx11::string::assign((char *)err);
    fclose(__stream);
  }
  bVar2 = false;
LAB_001061e7:
  std::__cxx11::string::~string((string *)&temp_path);
  ScopedMetric::~ScopedMetric(&metrics_h_scoped);
  return bVar2;
LAB_001060f2:
  bVar2 = WriteEntry(this_01,(FILE *)__stream,(LogEntry *)p_Var6[3]._M_nxt);
  if (!bVar2) goto code_r0x00106102;
  goto LAB_001060c7;
code_r0x00106102:
  piVar4 = __errno_location();
  strerror(*piVar4);
  std::__cxx11::string::assign((char *)err);
  fclose(__stream);
LAB_001061b6:
  bVar2 = false;
LAB_001061b8:
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&dead_outputs.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  goto LAB_001061e7;
}

Assistant:

bool BuildLog::Recompact(const string& path, const BuildLogUser& user,
                         string* err) {
  METRIC_RECORD(".ninja_log recompact");

  Close();
  string temp_path = path + ".recompact";
  FILE* f = fopen(temp_path.c_str(), "wb");
  if (!f) {
    *err = strerror(errno);
    return false;
  }

  if (fprintf(f, kFileSignature, kCurrentVersion) < 0) {
    *err = strerror(errno);
    fclose(f);
    return false;
  }

  vector<StringPiece> dead_outputs;
  for (Entries::iterator i = entries_.begin(); i != entries_.end(); ++i) {
    if (user.IsPathDead(i->first)) {
      dead_outputs.push_back(i->first);
      continue;
    }

    if (!WriteEntry(f, *i->second)) {
      *err = strerror(errno);
      fclose(f);
      return false;
    }
  }

  for (size_t i = 0; i < dead_outputs.size(); ++i)
    entries_.erase(dead_outputs[i]);

  fclose(f);
  if (unlink(path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  if (rename(temp_path.c_str(), path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  return true;
}